

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O1

int Pdr_ManCheckCube(Pdr_Man_t *p,int k,Pdr_Set_t *pCube,Pdr_Set_t **ppPred,int nConfLimit,
                    int fTryConf,int fUseLit)

{
  int *piVar1;
  long lVar2;
  abctime aVar3;
  Vec_Ptr_t *pVVar4;
  Pdr_Set_t **ppPVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  sat_solver *s;
  Vec_Int_t *pVVar9;
  long lVar10;
  Pdr_Set_t *pPVar11;
  long lVar12;
  long lVar13;
  int Lit;
  timespec ts;
  uint local_58;
  int local_54;
  timespec local_50;
  int local_40;
  int local_3c;
  Pdr_Set_t **local_38;
  
  p->nCalls = p->nCalls + 1;
  local_54 = nConfLimit;
  local_3c = fTryConf;
  s = Pdr_ManFetchSolver(p,k);
  local_40 = k;
  local_38 = ppPred;
  if (pCube == (Pdr_Set_t *)0x0) {
    iVar6 = clock_gettime(3,&local_50);
    if (iVar6 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    iVar6 = p->iOutCur;
    if (((long)iVar6 < 0) || (pVVar4 = p->pAig->vCos, pVVar4->nSize <= iVar6)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    iVar6 = Pdr_ObjSatVar(p,k,2,(Aig_Obj_t *)pVVar4->pArray[iVar6]);
    if (iVar6 < 0) {
LAB_005f16c0:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    local_58 = iVar6 * 2;
    lVar12 = p->timeToStop;
    lVar2 = p->timeToStopOne;
    lVar10 = lVar2;
    if (((lVar12 != 0) && (lVar10 = lVar12, lVar2 != 0)) && (lVar10 = lVar2, lVar12 < lVar2)) {
      lVar10 = lVar12;
    }
    aVar3 = s->nRuntimeLimit;
    s->nRuntimeLimit = lVar10;
    iVar6 = sat_solver_solve(s,(lit *)&local_58,&local_54,(long)local_54,0,0,0);
    s->nRuntimeLimit = aVar3;
    if (iVar6 == 0) {
      return -1;
    }
  }
  else {
    if (fUseLit == 0) {
      pVVar9 = Pdr_ManCubeToLits(p,k,pCube,0,1);
    }
    else {
      if ((k < 0) || (p->vActVars->nSize <= k)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar1 = p->vActVars->pArray + (uint)k;
      *piVar1 = *piVar1 + 1;
      pVVar9 = Pdr_ManCubeToLits(p,k,pCube,1,0);
      iVar6 = Pdr_ManFreeVar(p,k);
      if (iVar6 < 0) goto LAB_005f16c0;
      local_58 = iVar6 * 2;
      Vec_IntPush(pVVar9,local_58);
      iVar6 = sat_solver_addclause(s,pVVar9->pArray,pVVar9->pArray + pVVar9->nSize);
      if (iVar6 != 1) {
        __assert_fail("RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrSat.c"
                      ,0x143,
                      "int Pdr_ManCheckCube(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, int, int, int)"
                     );
      }
      if ((s->qtail != s->qhead) && (iVar6 = sat_solver_simplify(s), iVar6 == 0)) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                      ,0x102,"void sat_solver_compress(sat_solver *)");
      }
      pVVar9 = Pdr_ManCubeToLits(p,k,pCube,0,1);
      if ((int)local_58 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      Vec_IntPush(pVVar9,local_58 ^ 1);
    }
    iVar6 = clock_gettime(3,&local_50);
    if (iVar6 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    lVar12 = p->timeToStop;
    lVar2 = p->timeToStopOne;
    lVar10 = lVar2;
    if (((lVar12 != 0) && (lVar10 = lVar12, lVar2 != 0)) && (lVar10 = lVar2, lVar12 < lVar2)) {
      lVar10 = lVar12;
    }
    aVar3 = s->nRuntimeLimit;
    s->nRuntimeLimit = lVar10;
    iVar6 = local_54;
    if (local_3c != 0) {
      iVar6 = p->pPars->nConfGenLimit;
    }
    iVar6 = sat_solver_solve(s,pVVar9->pArray,pVVar9->pArray + pVVar9->nSize,(long)iVar6,0,0,0);
    s->nRuntimeLimit = aVar3;
    if (iVar6 == 0) {
      if (local_3c == 0) {
        return -1;
      }
      iVar6 = 1;
      if (p->pPars->nConfGenLimit == 0) {
        return -1;
      }
    }
  }
  iVar7 = clock_gettime(3,&local_50);
  ppPVar5 = local_38;
  iVar8 = local_40;
  if (iVar7 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  lVar12 = lVar12 - lVar13;
  p->tSat = p->tSat + lVar12;
  if (iVar6 == -1) {
    p->tSatUnsat = p->tSatUnsat + lVar12;
    p->nCallsU = p->nCallsU + 1;
    iVar6 = 1;
    if (local_38 != (Pdr_Set_t **)0x0) {
      *local_38 = (Pdr_Set_t *)0x0;
    }
  }
  else {
    p->tSatSat = p->tSatSat + lVar12;
    p->nCallsS = p->nCallsS + 1;
    iVar6 = 0;
    if (local_38 != (Pdr_Set_t **)0x0) {
      iVar7 = clock_gettime(3,&local_50);
      if (iVar7 < 0) {
        lVar13 = 1;
      }
      else {
        lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
        lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_50.tv_sec * -1000000;
      }
      if (p->pPars->fNewXSim == 0) {
        pPVar11 = Pdr_ManTernarySim(p,iVar8,pCube);
      }
      else {
        pPVar11 = Txs3_ManTernarySim(p->pTxs3,iVar8,pCube);
      }
      *ppPVar5 = pPVar11;
      iVar8 = clock_gettime(3,&local_50);
      if (iVar8 < 0) {
        lVar12 = -1;
      }
      else {
        lVar12 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      p->tTsim = p->tTsim + lVar12 + lVar13;
      p->nXsimLits = p->nXsimLits + (*ppPVar5)->nLits;
      p->nXsimRuns = p->nXsimRuns + 1;
    }
  }
  return iVar6;
}

Assistant:

int Pdr_ManCheckCube( Pdr_Man_t * p, int k, Pdr_Set_t * pCube, Pdr_Set_t ** ppPred, int nConfLimit, int fTryConf, int fUseLit )
{ 
    //int fUseLit = 0;
    int fLitUsed = 0;
    sat_solver * pSat;
    Vec_Int_t * vLits;
    int Lit, RetValue;
    abctime clk, Limit;
    p->nCalls++;
    pSat = Pdr_ManFetchSolver( p, k );
    if ( pCube == NULL ) // solve the property
    {
        clk = Abc_Clock();
        Lit = Abc_Var2Lit( Pdr_ObjSatVar(p, k, 2, Aig_ManCo(p->pAig, p->iOutCur)), 0 ); // pos literal (property fails)
        Limit = sat_solver_set_runtime_limit( pSat, Pdr_ManTimeLimit(p) );
        RetValue = sat_solver_solve( pSat, &Lit, &Lit + 1, nConfLimit, 0, 0, 0 );
        sat_solver_set_runtime_limit( pSat, Limit );
        if ( RetValue == l_Undef )
            return -1;
    }
    else // check relative containment in terms of next states
    {
        if ( fUseLit )
        {
            fLitUsed = 1;
            Vec_IntAddToEntry( p->vActVars, k, 1 );
            // add the cube in terms of current state variables
            vLits = Pdr_ManCubeToLits( p, k, pCube, 1, 0 );
            // add activation literal
            Lit = Abc_Var2Lit( Pdr_ManFreeVar(p, k), 0 );
            // add activation literal
            Vec_IntPush( vLits, Lit );
            RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
            assert( RetValue == 1 );
            sat_solver_compress( pSat );
            // create assumptions
            vLits = Pdr_ManCubeToLits( p, k, pCube, 0, 1 );
            // add activation literal
            Vec_IntPush( vLits, Abc_LitNot(Lit) );
        }
        else
            vLits = Pdr_ManCubeToLits( p, k, pCube, 0, 1 );

        // solve 
        clk = Abc_Clock();
        Limit = sat_solver_set_runtime_limit( pSat, Pdr_ManTimeLimit(p) );
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), fTryConf ? p->pPars->nConfGenLimit : nConfLimit, 0, 0, 0 );
        sat_solver_set_runtime_limit( pSat, Limit );
        if ( RetValue == l_Undef )
        {
            if ( fTryConf && p->pPars->nConfGenLimit )
                RetValue = l_True;
            else
                return -1;
        }
    }
    clk = Abc_Clock() - clk;
    p->tSat += clk;
    assert( RetValue != l_Undef );
    if ( RetValue == l_False )
    {
        p->tSatUnsat += clk;
        p->nCallsU++;
        if ( ppPred )
            *ppPred = NULL;
        RetValue = 1;
    }
    else // if ( RetValue == l_True )
    {
        p->tSatSat += clk;
        p->nCallsS++;
        if ( ppPred )
        {
            abctime clk = Abc_Clock();
            if ( p->pPars->fNewXSim )
                *ppPred = Txs3_ManTernarySim( p->pTxs3, k, pCube );
            else
                *ppPred = Pdr_ManTernarySim( p, k, pCube );
            p->tTsim += Abc_Clock() - clk;
            p->nXsimLits += (*ppPred)->nLits;
            p->nXsimRuns++;
        }
        RetValue = 0;
    }

/* // for some reason, it does not work...
    if ( fLitUsed )
    {
        int RetValue;
        Lit = Abc_LitNot(Lit);
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
        assert( RetValue == 1 );
        sat_solver_compress( pSat );
    }
*/
    return RetValue;
}